

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseReference(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  code *pcVar2;
  undefined8 uVar3;
  xmlNodePtr pxVar4;
  _xmlNode *p_Var5;
  uint val_00;
  int iVar6;
  xmlChar *pxVar7;
  bool bVar8;
  xmlChar *nbktext;
  xmlNodePtr firstChild_1;
  xmlNodePtr last;
  xmlNodePtr next;
  xmlNodePtr cur_1;
  xmlNodePtr nw_1;
  xmlNodePtr firstChild;
  xmlNodePtr cur;
  xmlNodePtr nw;
  void *user_data_1;
  void *user_data;
  unsigned_long diff;
  unsigned_long oldnbent;
  int value;
  int hex;
  xmlChar out [16];
  int i;
  xmlParserErrors ret;
  xmlNodePtr list;
  xmlChar *pxStack_20;
  int was_checked;
  xmlChar *val;
  xmlEntityPtr ent;
  xmlParserCtxtPtr ctxt_local;
  
  _i = (xmlNodePtr)0x0;
  out[0xc] = '\0';
  out[0xd] = '\0';
  out[0xe] = '\0';
  out[0xf] = '\0';
  if (*ctxt->input->cur == '&') {
    ent = (xmlEntityPtr)ctxt;
    if (ctxt->input->cur[1] == '#') {
      out[8] = '\0';
      out[9] = '\0';
      out[10] = '\0';
      out[0xb] = '\0';
      xVar1 = ctxt->input->cur[2];
      val_00 = xmlParseCharRef(ctxt);
      if (val_00 != 0) {
        if (*(int *)&ent[3]._private == 1) {
          iVar6 = xmlCopyCharMultiByte((xmlChar *)((long)&value + (long)(int)out._8_4_),val_00);
          out._8_4_ = iVar6 + out._8_4_;
          *(undefined1 *)((long)&value + (long)(int)out._8_4_) = 0;
          if (((ent->_private != (void *)0x0) && (*(long *)((long)ent->_private + 0x88) != 0)) &&
             (*(int *)((long)&ent[2].prev + 4) == 0)) {
            (**(code **)((long)ent->_private + 0x88))(*(undefined8 *)&ent->type,&value,out._8_4_);
          }
        }
        else if ((int)val_00 < 0x100) {
          value._0_1_ = (undefined1)val_00;
          value._1_1_ = 0;
          if (((ent->_private != (void *)0x0) && (*(long *)((long)ent->_private + 0x88) != 0)) &&
             (*(int *)((long)&ent[2].prev + 4) == 0)) {
            (**(code **)((long)ent->_private + 0x88))(*(undefined8 *)&ent->type,&value,1);
          }
        }
        else {
          if ((xVar1 == 'x') || (xVar1 == 'X')) {
            snprintf((char *)&value,0x10,"#x%X",(ulong)val_00);
          }
          else {
            snprintf((char *)&value,0x10,"#%d",(ulong)val_00);
          }
          if (((ent->_private != (void *)0x0) && (*(long *)((long)ent->_private + 0x80) != 0)) &&
             (*(int *)((long)&ent[2].prev + 4) == 0)) {
            (**(code **)((long)ent->_private + 0x80))(*(undefined8 *)&ent->type,&value);
          }
        }
      }
    }
    else {
      val = (xmlChar *)xmlParseEntityRef(ctxt);
      if (((xmlEntityPtr)val != (xmlEntityPtr)0x0) && (*(int *)&ent->children != 0)) {
        list._4_4_ = ((xmlEntityPtr)val)->checked;
        if ((((xmlEntityPtr)val)->name == (xmlChar *)0x0) ||
           (((xmlEntityPtr)val)->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
          pxVar7 = ((xmlEntityPtr)val)->content;
          if ((((pxVar7 != (xmlChar *)0x0) && (ent->_private != (void *)0x0)) &&
              (*(long *)((long)ent->_private + 0x88) != 0)) &&
             (*(int *)((long)&ent[2].prev + 4) == 0)) {
            pcVar2 = *(code **)((long)ent->_private + 0x88);
            uVar3 = *(undefined8 *)&ent->type;
            pxStack_20 = pxVar7;
            iVar6 = xmlStrlen(pxVar7);
            (*pcVar2)(uVar3,pxVar7,iVar6);
          }
        }
        else {
          if (((((xmlEntityPtr)val)->checked == 0) ||
              ((((xmlEntityPtr)val)->children == (_xmlNode *)0x0 &&
               (((ulong)ent[4].name & 0x200000000) != 0)))) &&
             ((((xmlEntityPtr)val)->etype != XML_EXTERNAL_GENERAL_PARSED_ENTITY ||
              (((ulong)ent[4].name & 0x1200000000) != 0)))) {
            pxVar7 = ent[5].name;
            if (*(xmlEntityPtr *)&ent->type == ent) {
              user_data_1 = (void *)0x0;
            }
            else {
              user_data_1 = *(void **)&ent->type;
            }
            if (((xmlEntityPtr)val)->etype == XML_INTERNAL_GENERAL_ENTITY) {
              *(int *)&ent[2].URI = *(int *)&ent[2].URI + 1;
              out._12_4_ = xmlParseBalancedChunkMemoryInternal
                                     ((xmlParserCtxtPtr)ent,((xmlEntityPtr)val)->content,user_data_1
                                      ,(xmlNodePtr *)&i);
              *(int *)&ent[2].URI = *(int *)&ent[2].URI + -1;
            }
            else if (((xmlEntityPtr)val)->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
              *(int *)&ent[2].URI = *(int *)&ent[2].URI + 1;
              out._12_4_ = xmlParseExternalEntityPrivate
                                     ((xmlDocPtr)ent->name,(xmlParserCtxtPtr)ent,
                                      (xmlSAXHandlerPtr)ent->_private,user_data_1,
                                      *(int *)&ent[2].URI,((xmlEntityPtr)val)->URI,
                                      ((xmlEntityPtr)val)->ExternalID,(xmlNodePtr *)&i);
              *(int *)&ent[2].URI = *(int *)&ent[2].URI + -1;
            }
            else {
              out[0xc] = 'X';
              out[0xd] = '\0';
              out[0xe] = '\0';
              out[0xf] = '\0';
              xmlErrMsgStr((xmlParserCtxtPtr)ent,XML_ERR_INTERNAL_ERROR,
                           "invalid entity type found\n",(xmlChar *)0x0);
            }
            user_data = ent[5].name + (1 - (long)pxVar7);
            if ((xmlChar *)0x3fffffff < user_data) {
              user_data = (void *)0x3fffffff;
            }
            *(int *)(val + 0x84) = (int)((long)user_data << 1);
            if ((*(long *)(val + 0x50) != 0) &&
               (pxVar7 = xmlStrchr(*(xmlChar **)(val + 0x50),'<'), pxVar7 != (xmlChar *)0x0)) {
              *(uint *)(val + 0x84) = *(uint *)(val + 0x84) | 1;
            }
            if (out._12_4_ == 0x59) {
              xmlFatalErr((xmlParserCtxtPtr)ent,XML_ERR_ENTITY_LOOP,(char *)0x0);
              xmlHaltParser((xmlParserCtxtPtr)ent);
              xmlFreeNodeList(_i);
              return;
            }
            iVar6 = xmlParserEntityCheck((xmlParserCtxtPtr)ent,0,(xmlEntityPtr)val,0);
            if (iVar6 != 0) {
              xmlFreeNodeList(_i);
              return;
            }
            if ((out._12_4_ == 0) && (_i != (xmlNodePtr)0x0)) {
              if (((*(int *)(val + 0x5c) == 1) || (*(int *)(val + 0x5c) == 2)) &&
                 (*(long *)(val + 0x18) == 0)) {
                *(xmlNodePtr *)(val + 0x18) = _i;
                if (((*(int *)((long)&ent->children + 4) == 0) ||
                    (ent[5].type == XML_ENTITY_REF_NODE)) ||
                   ((_i->type == XML_TEXT_NODE && (_i->next == (_xmlNode *)0x0)))) {
                  val[0x80] = '\x01';
                  val[0x81] = '\0';
                  val[0x82] = '\0';
                  val[0x83] = '\0';
                  for (; _i != (xmlNodePtr)0x0; _i = _i->next) {
                    _i->parent = (_xmlNode *)val;
                    xmlSetTreeDoc(_i,*(xmlDocPtr *)(val + 0x40));
                    if (_i->next == (_xmlNode *)0x0) {
                      *(xmlNodePtr *)(val + 0x20) = _i;
                    }
                  }
                  _i = (xmlNodePtr)0x0;
                }
                else {
                  val[0x80] = '\0';
                  val[0x81] = '\0';
                  val[0x82] = '\0';
                  val[0x83] = '\0';
                  for (; _i != (xmlNodePtr)0x0; _i = _i->next) {
                    _i->parent = (_xmlNode *)ent->content;
                    _i->doc = (_xmlDoc *)ent->name;
                    if (_i->next == (_xmlNode *)0x0) {
                      *(xmlNodePtr *)(val + 0x20) = _i;
                    }
                  }
                  _i = *(xmlNodePtr *)(val + 0x18);
                  if (*(int *)(val + 0x5c) == 2) {
                    xmlAddEntityReference((xmlEntityPtr)val,_i,(xmlNodePtr)0x0);
                  }
                }
              }
              else {
                xmlFreeNodeList(_i);
                _i = (xmlNodePtr)0x0;
              }
            }
            else if ((out._12_4_ == 0) || (out._12_4_ == 0x1b)) {
              if (_i != (xmlNodePtr)0x0) {
                xmlFreeNodeList(_i);
                _i = (xmlNodePtr)0x0;
              }
            }
            else {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)ent,XML_ERR_UNDECLARED_ENTITY,
                                "Entity \'%s\' failed to parse\n",*(xmlChar **)(val + 0x10));
              if (*(long *)(val + 0x50) != 0) {
                **(undefined1 **)(val + 0x50) = 0;
              }
              xmlParserEntityCheck((xmlParserCtxtPtr)ent,0,(xmlEntityPtr)val,0);
            }
            if (*(int *)(val + 0x84) == 0) {
              val[0x84] = '\x02';
              val[0x85] = '\0';
              val[0x86] = '\0';
              val[0x87] = '\0';
            }
            list._4_4_ = 0;
          }
          else if (((xmlEntityPtr)val)->checked != 1) {
            ent[5].name = ent[5].name + ((xmlEntityPtr)val)->checked / 2;
          }
          if (*(long *)(val + 0x18) == 0) {
            if (list._4_4_ != 0) {
              if (*(xmlEntityPtr *)&ent->type == ent) {
                nw = (xmlNodePtr)0x0;
              }
              else {
                nw = *(xmlNodePtr *)&ent->type;
              }
              if (*(int *)(val + 0x5c) == 1) {
                *(int *)&ent[2].URI = *(int *)&ent[2].URI + 1;
                out._12_4_ = xmlParseBalancedChunkMemoryInternal
                                       ((xmlParserCtxtPtr)ent,*(xmlChar **)(val + 0x50),nw,
                                        (xmlNodePtr *)0x0);
                *(int *)&ent[2].URI = *(int *)&ent[2].URI + -1;
              }
              else if (*(int *)(val + 0x5c) == 2) {
                *(int *)&ent[2].URI = *(int *)&ent[2].URI + 1;
                out._12_4_ = xmlParseExternalEntityPrivate
                                       ((xmlDocPtr)ent->name,(xmlParserCtxtPtr)ent,
                                        (xmlSAXHandlerPtr)ent->_private,nw,*(int *)&ent[2].URI,
                                        *(xmlChar **)(val + 0x78),*(xmlChar **)(val + 0x60),
                                        (xmlNodePtr *)0x0);
                *(int *)&ent[2].URI = *(int *)&ent[2].URI + -1;
              }
              else {
                out[0xc] = 'X';
                out[0xd] = '\0';
                out[0xe] = '\0';
                out[0xf] = '\0';
                xmlErrMsgStr((xmlParserCtxtPtr)ent,XML_ERR_INTERNAL_ERROR,
                             "invalid entity type found\n",(xmlChar *)0x0);
              }
              if (out._12_4_ == 0x59) {
                xmlFatalErr((xmlParserCtxtPtr)ent,XML_ERR_ENTITY_LOOP,(char *)0x0);
                return;
              }
            }
            if ((((ent->_private != (void *)0x0) && (*(long *)((long)ent->_private + 0x80) != 0)) &&
                (*(int *)((long)&ent->children + 4) == 0)) &&
               (*(int *)((long)&ent[2].prev + 4) == 0)) {
              (**(code **)((long)ent->_private + 0x80))
                        (*(undefined8 *)&ent->type,*(undefined8 *)(val + 0x10));
            }
          }
          else if (((ent->_private == (void *)0x0) || (*(long *)((long)ent->_private + 0x80) == 0))
                  || ((*(int *)((long)&ent->children + 4) != 0 ||
                      (*(int *)((long)&ent[2].prev + 4) != 0)))) {
            if ((((*(int *)((long)&ent->children + 4) != 0) || (*(long *)(val + 0x18) == 0)) &&
                (ent->content != (xmlChar *)0x0)) && (*(long *)(val + 0x18) != 0)) {
              if (((_i == (xmlNodePtr)0x0) && (*(int *)(val + 0x80) == 0)) ||
                 (ent[5].type == XML_ENTITY_REF_NODE)) {
                cur = (xmlNodePtr)0x0;
                nw_1 = (xmlNodePtr)0x0;
                ent[5].doc = (_xmlDoc *)
                             ((long)&(ent[5].doc)->_private + (long)(*(int *)(val + 0x58) + 5));
                iVar6 = xmlParserEntityCheck
                                  ((xmlParserCtxtPtr)ent,0,(xmlEntityPtr)val,(size_t)ent[5].doc);
                if (iVar6 != 0) {
                  return;
                }
                for (firstChild = *(xmlNodePtr *)(val + 0x18); firstChild != (xmlNodePtr)0x0;
                    firstChild = firstChild->next) {
                  cur = xmlDocCopyNode(firstChild,(xmlDocPtr)ent->name,1);
                  if (cur != (xmlNodePtr)0x0) {
                    if (cur->_private == (void *)0x0) {
                      cur->_private = firstChild->_private;
                    }
                    if (nw_1 == (xmlNodePtr)0x0) {
                      nw_1 = cur;
                    }
                    cur = xmlAddChild((xmlNodePtr)ent->content,cur);
                  }
                  if (firstChild == *(xmlNodePtr *)(val + 0x20)) {
                    if (((ent[5].type == XML_ENTITY_REF_NODE) && (cur != (xmlNodePtr)0x0)) &&
                       ((cur->type == XML_ELEMENT_NODE && (cur->children == (_xmlNode *)0x0)))) {
                      cur->extra = 1;
                    }
                    break;
                  }
                }
                if (*(int *)(val + 0x5c) == 2) {
                  xmlAddEntityReference((xmlEntityPtr)val,nw_1,cur);
                }
              }
              else if ((_i == (xmlNodePtr)0x0) || (0 < *(int *)&ent->doc)) {
                cur_1 = (xmlNodePtr)0x0;
                nbktext = (xmlChar *)0x0;
                ent[5].doc = (_xmlDoc *)
                             ((long)&(ent[5].doc)->_private + (long)(*(int *)(val + 0x58) + 5));
                iVar6 = xmlParserEntityCheck
                                  ((xmlParserCtxtPtr)ent,0,(xmlEntityPtr)val,(size_t)ent[5].doc);
                if (iVar6 != 0) {
                  return;
                }
                next = *(xmlNodePtr *)(val + 0x18);
                val[0x18] = '\0';
                val[0x19] = '\0';
                val[0x1a] = '\0';
                val[0x1b] = '\0';
                val[0x1c] = '\0';
                val[0x1d] = '\0';
                val[0x1e] = '\0';
                val[0x1f] = '\0';
                pxVar4 = *(xmlNodePtr *)(val + 0x20);
                val[0x20] = '\0';
                val[0x21] = '\0';
                val[0x22] = '\0';
                val[0x23] = '\0';
                val[0x24] = '\0';
                val[0x25] = '\0';
                val[0x26] = '\0';
                val[0x27] = '\0';
                do {
                  if (next == (xmlNodePtr)0x0) break;
                  p_Var5 = next->next;
                  next->next = (_xmlNode *)0x0;
                  next->parent = (_xmlNode *)0x0;
                  cur_1 = xmlDocCopyNode(next,(xmlDocPtr)ent->name,1);
                  if (cur_1 != (xmlNodePtr)0x0) {
                    if (cur_1->_private == (void *)0x0) {
                      cur_1->_private = next->_private;
                    }
                    if (nbktext == (xmlChar *)0x0) {
                      nbktext = (xmlChar *)next;
                    }
                    xmlAddChild((xmlNodePtr)val,cur_1);
                    xmlAddChild((xmlNodePtr)ent->content,next);
                  }
                  bVar8 = next != pxVar4;
                  next = p_Var5;
                } while (bVar8);
                if (*(int *)(val + 0x80) == 0) {
                  val[0x80] = '\x01';
                  val[0x81] = '\0';
                  val[0x82] = '\0';
                  val[0x83] = '\0';
                }
                if (*(int *)(val + 0x5c) == 2) {
                  xmlAddEntityReference((xmlEntityPtr)val,(xmlNodePtr)nbktext,cur_1);
                }
              }
              else {
                pxVar7 = xmlDictLookup((xmlDictPtr)ent[3].next,(xmlChar *)"nbktext",-1);
                if (*(int *)(*(long *)(val + 0x18) + 8) == 3) {
                  *(xmlChar **)(*(long *)(val + 0x18) + 0x10) = pxVar7;
                }
                if ((*(long *)(val + 0x20) != *(long *)(val + 0x18)) &&
                   (*(int *)(*(long *)(val + 0x20) + 8) == 3)) {
                  *(xmlChar **)(*(long *)(val + 0x20) + 0x10) = pxVar7;
                }
                xmlAddChildList((xmlNodePtr)ent->content,*(xmlNodePtr *)(val + 0x18));
              }
              ent[3].type = 0;
              *(undefined4 *)((long)&ent[3]._private + 4) = 0;
            }
          }
          else {
            (**(code **)((long)ent->_private + 0x80))
                      (*(undefined8 *)&ent->type,*(undefined8 *)(val + 0x10));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlParseReference(xmlParserCtxtPtr ctxt) {
    xmlEntityPtr ent;
    xmlChar *val;
    int was_checked;
    xmlNodePtr list = NULL;
    xmlParserErrors ret = XML_ERR_OK;

    DEBUG_ENTER(("xmlParseReference(%s);\n", dbgCtxt(ctxt)));

    if (RAW != '&')
        RETURN();

    /*
     * Simple case of a CharRef
     */
    if (NXT(1) == '#') {
	int i = 0;
	xmlChar out[16];
	int hex = NXT(2);
	int value = xmlParseCharRef(ctxt);

	if (value == 0)
	    RETURN();
	if (ctxt->charset != XML_CHAR_ENCODING_UTF8) {
	    /*
	     * So we are using non-UTF-8 buffers
	     * Check that the char fit on 8bits, if not
	     * generate a CharRef.
	     */
	    if (value <= 0xFF) {
		out[0] = value;
		out[1] = 0;
		if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
		    (!ctxt->disableSAX))
		    ctxt->sax->characters(ctxt->userData, out, 1);
	    } else {
		if ((hex == 'x') || (hex == 'X'))
		    snprintf((char *)out, sizeof(out), "#x%X", value);
		else
		    snprintf((char *)out, sizeof(out), "#%d", value);
		if ((ctxt->sax != NULL) && (ctxt->sax->reference != NULL) &&
		    (!ctxt->disableSAX))
		    ctxt->sax->reference(ctxt->userData, out);
	    }
	} else {
	    /*
	     * Just encode the value in UTF-8
	     */
	    COPY_BUF(0 ,out, i, value);
	    out[i] = 0;
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->characters(ctxt->userData, out, i);
	}
	RETURN();
    }

    /*
     * We are seeing an entity reference
     */
    ent = xmlParseEntityRef(ctxt);
    if (ent == NULL) RETURN();
    if (!ctxt->wellFormed)
	RETURN();
    was_checked = ent->checked;

    /* special case of predefined entities */
    if ((ent->name == NULL) ||
        (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
	val = ent->content;
	if (val == NULL) RETURN();
	/*
	 * inline the entity.
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->characters(ctxt->userData, val, xmlStrlen(val));
	RETURN();
    }

    /*
     * The first reference to the entity trigger a parsing phase
     * where the ent->children is filled with the result from
     * the parsing.
     * Note: external parsed entities will not be loaded, it is not
     * required for a non-validating parser, unless the parsing option
     * of validating, or substituting entities were given. Doing so is
     * far more secure as the parser will only process data coming from
     * the document entity by default.
     */
    if (((ent->checked == 0) ||
         ((ent->children == NULL) && (ctxt->options & XML_PARSE_NOENT))) &&
        ((ent->etype != XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
         (ctxt->options & (XML_PARSE_NOENT | XML_PARSE_DTDVALID)))) {
	unsigned long oldnbent = ctxt->nbentities, diff;

	/*
	 * This is a bit hackish but this seems the best
	 * way to make sure both SAX and DOM entity support
	 * behaves okay.
	 */
	void *user_data;
	if (ctxt->userData == ctxt)
	    user_data = NULL;
	else
	    user_data = ctxt->userData;

	/*
	 * Check that this entity is well formed
	 * 4.3.2: An internal general parsed entity is well-formed
	 * if its replacement text matches the production labeled
	 * content.
	 */
	if (ent->etype == XML_INTERNAL_GENERAL_ENTITY) {
	    ctxt->depth++;
	    ret = xmlParseBalancedChunkMemoryInternal(ctxt, ent->content,
	                                              user_data, &list);
	    ctxt->depth--;

	} else if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
	    ctxt->depth++;
	    ret = xmlParseExternalEntityPrivate(ctxt->myDoc, ctxt, ctxt->sax,
	                                   user_data, ctxt->depth, ent->URI,
					   ent->ExternalID, &list);
	    ctxt->depth--;
	} else {
	    ret = XML_ERR_ENTITY_PE_INTERNAL;
	    xmlErrMsgStr(ctxt, XML_ERR_INTERNAL_ERROR,
			 "invalid entity type found\n", NULL);
	}

	/*
	 * Store the number of entities needing parsing for this entity
	 * content and do checkings
	 */
        diff = ctxt->nbentities - oldnbent + 1;
        if (diff > INT_MAX / 2)
            diff = INT_MAX / 2;
        ent->checked = diff * 2;
	if ((ent->content != NULL) && (xmlStrchr(ent->content, '<')))
	    ent->checked |= 1;
	if (ret == XML_ERR_ENTITY_LOOP) {
	    xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
            xmlHaltParser(ctxt);
	    xmlFreeNodeList(list);
	    RETURN();
	}
	if (xmlParserEntityCheck(ctxt, 0, ent, 0)) {
	    xmlFreeNodeList(list);
	    RETURN();
	}

	if ((ret == XML_ERR_OK) && (list != NULL)) {
	    if (((ent->etype == XML_INTERNAL_GENERAL_ENTITY) ||
	     (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY))&&
		(ent->children == NULL)) {
		ent->children = list;
                /*
                 * Prune it directly in the generated document
                 * except for single text nodes.
                 */
                if ((ctxt->replaceEntities == 0) ||
                    (ctxt->parseMode == XML_PARSE_READER) ||
                    ((list->type == XML_TEXT_NODE) &&
                     (list->next == NULL))) {
                    ent->owner = 1;
                    while (list != NULL) {
                        list->parent = (xmlNodePtr) ent;
                        xmlSetTreeDoc(list, ent->doc);
                        if (list->next == NULL)
                            ent->last = list;
                        list = list->next;
                    }
                    list = NULL;
                } else {
                    ent->owner = 0;
                    while (list != NULL) {
                        list->parent = (xmlNodePtr) ctxt->node;
                        list->doc = ctxt->myDoc;
                        if (list->next == NULL)
                            ent->last = list;
                        list = list->next;
                    }
                    list = ent->children;
#ifdef LIBXML_LEGACY_ENABLED
                    if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)
                        xmlAddEntityReference(ent, list, NULL);
#endif /* LIBXML_LEGACY_ENABLED */
                }
	    } else {
		xmlFreeNodeList(list);
		list = NULL;
	    }
	} else if ((ret != XML_ERR_OK) &&
		   (ret != XML_WAR_UNDECLARED_ENTITY)) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
		     "Entity '%s' failed to parse\n", ent->name);
            if (ent->content != NULL)
                ent->content[0] = 0;
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	} else if (list != NULL) {
	    xmlFreeNodeList(list);
	    list = NULL;
	}
	if (ent->checked == 0)
	    ent->checked = 2;

        /* Prevent entity from being parsed and expanded twice (Bug 760367). */
        was_checked = 0;
    } else if (ent->checked != 1) {
	ctxt->nbentities += ent->checked / 2;
    }

    /*
     * Now that the entity content has been gathered
     * provide it to the application, this can take different forms based
     * on the parsing modes.
     */
    if (ent->children == NULL) {
	/*
	 * Probably running in SAX mode and the callbacks don't
	 * build the entity content. So unless we already went
	 * though parsing for first checking go though the entity
	 * content to generate callbacks associated to the entity
	 */
	if (was_checked != 0) {
	    void *user_data;
	    /*
	     * This is a bit hackish but this seems the best
	     * way to make sure both SAX and DOM entity support
	     * behaves okay.
	     */
	    if (ctxt->userData == ctxt)
		user_data = NULL;
	    else
		user_data = ctxt->userData;

	    if (ent->etype == XML_INTERNAL_GENERAL_ENTITY) {
		ctxt->depth++;
		ret = xmlParseBalancedChunkMemoryInternal(ctxt,
				   ent->content, user_data, NULL);
		ctxt->depth--;
	    } else if (ent->etype ==
		       XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
		ctxt->depth++;
		ret = xmlParseExternalEntityPrivate(ctxt->myDoc, ctxt,
			   ctxt->sax, user_data, ctxt->depth,
			   ent->URI, ent->ExternalID, NULL);
		ctxt->depth--;
	    } else {
		ret = XML_ERR_ENTITY_PE_INTERNAL;
		xmlErrMsgStr(ctxt, XML_ERR_INTERNAL_ERROR,
			     "invalid entity type found\n", NULL);
	    }
	    if (ret == XML_ERR_ENTITY_LOOP) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
		RETURN();
	    }
	}
	if ((ctxt->sax != NULL) && (ctxt->sax->reference != NULL) &&
	    (ctxt->replaceEntities == 0) && (!ctxt->disableSAX)) {
	    /*
	     * Entity reference callback comes second, it's somewhat
	     * superfluous but a compatibility to historical behaviour
	     */
	    ctxt->sax->reference(ctxt->userData, ent->name);
	}
	RETURN();
    }

    /*
     * If we didn't get any children for the entity being built
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->reference != NULL) &&
	(ctxt->replaceEntities == 0) && (!ctxt->disableSAX)) {
	/*
	 * Create a node.
	 */
	ctxt->sax->reference(ctxt->userData, ent->name);
	RETURN();
    }

    if ((ctxt->replaceEntities) || (ent->children == NULL))  {
	/*
	 * There is a problem on the handling of _private for entities
	 * (bug 155816): Should we copy the content of the field from
	 * the entity (possibly overwriting some value set by the user
	 * when a copy is created), should we leave it alone, or should
	 * we try to take care of different situations?  The problem
	 * is exacerbated by the usage of this field by the xmlReader.
	 * To fix this bug, we look at _private on the created node
	 * and, if it's NULL, we copy in whatever was in the entity.
	 * If it's not NULL we leave it alone.  This is somewhat of a
	 * hack - maybe we should have further tests to determine
	 * what to do.
	 */
	if ((ctxt->node != NULL) && (ent->children != NULL)) {
	    /*
	     * Seems we are generating the DOM content, do
	     * a simple tree copy for all references except the first
	     * In the first occurrence list contains the replacement.
	     */
	    if (((list == NULL) && (ent->owner == 0)) ||
		(ctxt->parseMode == XML_PARSE_READER)) {
		xmlNodePtr nw = NULL, cur, firstChild = NULL;

		/*
		 * We are copying here, make sure there is no abuse
		 */
		ctxt->sizeentcopy += ent->length + 5;
		if (xmlParserEntityCheck(ctxt, 0, ent, ctxt->sizeentcopy))
		    RETURN();

		/*
		 * when operating on a reader, the entities definitions
		 * are always owning the entities subtree.
		if (ctxt->parseMode == XML_PARSE_READER)
		    ent->owner = 1;
		 */

		cur = ent->children;
		while (cur != NULL) {
		    nw = xmlDocCopyNode(cur, ctxt->myDoc, 1);
		    if (nw != NULL) {
			if (nw->_private == NULL)
			    nw->_private = cur->_private;
			if (firstChild == NULL){
			    firstChild = nw;
			}
			nw = xmlAddChild(ctxt->node, nw);
		    }
		    if (cur == ent->last) {
			/*
			 * needed to detect some strange empty
			 * node cases in the reader tests
			 */
			if ((ctxt->parseMode == XML_PARSE_READER) &&
			    (nw != NULL) &&
			    (nw->type == XML_ELEMENT_NODE) &&
			    (nw->children == NULL))
			    nw->extra = 1;

			break;
		    }
		    cur = cur->next;
		}
#ifdef LIBXML_LEGACY_ENABLED
		if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)
		  xmlAddEntityReference(ent, firstChild, nw);
#endif /* LIBXML_LEGACY_ENABLED */
	    } else if ((list == NULL) || (ctxt->inputNr > 0)) {
		xmlNodePtr nw = NULL, cur, next, last,
			   firstChild = NULL;

		/*
		 * We are copying here, make sure there is no abuse
		 */
		ctxt->sizeentcopy += ent->length + 5;
		if (xmlParserEntityCheck(ctxt, 0, ent, ctxt->sizeentcopy))
		    RETURN();

		/*
		 * Copy the entity child list and make it the new
		 * entity child list. The goal is to make sure any
		 * ID or REF referenced will be the one from the
		 * document content and not the entity copy.
		 */
		cur = ent->children;
		ent->children = NULL;
		last = ent->last;
		ent->last = NULL;
		while (cur != NULL) {
		    next = cur->next;
		    cur->next = NULL;
		    cur->parent = NULL;
		    nw = xmlDocCopyNode(cur, ctxt->myDoc, 1);
		    if (nw != NULL) {
			if (nw->_private == NULL)
			    nw->_private = cur->_private;
			if (firstChild == NULL){
			    firstChild = cur;
			}
			xmlAddChild((xmlNodePtr) ent, nw);
			xmlAddChild(ctxt->node, cur);
		    }
		    if (cur == last)
			break;
		    cur = next;
		}
		if (ent->owner == 0)
		    ent->owner = 1;
#ifdef LIBXML_LEGACY_ENABLED
		if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)
		  xmlAddEntityReference(ent, firstChild, nw);
#endif /* LIBXML_LEGACY_ENABLED */
	    } else {
		const xmlChar *nbktext;

		/*
		 * the name change is to avoid coalescing of the
		 * node with a possible previous text one which
		 * would make ent->children a dangling pointer
		 */
		nbktext = xmlDictLookup(ctxt->dict, BAD_CAST "nbktext",
					-1);
		if (ent->children->type == XML_TEXT_NODE)
		    ent->children->name = nbktext;
		if ((ent->last != ent->children) &&
		    (ent->last->type == XML_TEXT_NODE))
		    ent->last->name = nbktext;
		xmlAddChildList(ctxt->node, ent->children);
	    }

	    /*
	     * This is to avoid a nasty side effect, see
	     * characters() in SAX.c
	     */
	    ctxt->nodemem = 0;
	    ctxt->nodelen = 0;
	    RETURN();
	}
    }
    RETURN();
}